

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O3

void __thiscall
CommandDrawNumber::Tick
          (CommandDrawNumber *this,SBarInfoMainBlock *block,DSBarInfo *statusBar,bool hudChanged)

{
  FString *this_00;
  player_t *ppVar1;
  APlayerPawn *pAVar2;
  SBarInfo *pSVar3;
  char *pcVar4;
  int iVar5;
  uint uVar6;
  AInventory *item;
  AInventory *pAVar7;
  FBaseCVar *pFVar8;
  AAmmo *pAVar9;
  Node *pNVar10;
  AInventory *pAVar11;
  undefined4 extraout_var;
  long lVar13;
  byte bVar14;
  PClass *pPVar15;
  PClass *pPVar16;
  int iVar17;
  int iVar18;
  BYTE *pBVar19;
  byte bVar20;
  uint uVar21;
  uint uVar22;
  double dVar23;
  PClass *pPVar12;
  
  if ((this->super_CommandDrawString).field_0x5f == '\x01') {
    (this->super_CommandDrawString).cache = -1;
    CommandDrawString::Tick(&this->super_CommandDrawString,block,statusBar,hudChanged);
  }
  uVar21 = (this->super_CommandDrawString).valueArgument;
  if (INTCVAR < this->value) goto LAB_004c4cf5;
  switch(this->value) {
  case HEALTH:
    uVar22 = (((statusBar->super_DBaseStatusBar).CPlayer)->mo->super_AActor).health;
    pSVar3 = (this->super_CommandDrawString).super_SBarInfoCommand.script;
    uVar21 = 0;
    if (0 < (int)uVar22) {
      uVar21 = uVar22;
    }
    if (pSVar3->lowerHealthCap == false) {
      uVar21 = uVar22;
    }
    if (pSVar3->interpolateHealth == true) {
      iVar5 = pSVar3->interpolationSpeed;
LAB_004c4cd8:
      this->interpolationSpeed = iVar5;
    }
    break;
  case ARMOR:
    if (statusBar->armor == (ABasicArmor *)0x0) {
      uVar21 = 0;
    }
    else {
      uVar21 = (statusBar->armor->super_AArmor).super_AInventory.Amount;
    }
    pSVar3 = (this->super_CommandDrawString).super_SBarInfoCommand.script;
    if (pSVar3->interpolateArmor == true) {
      iVar5 = pSVar3->armorInterpolationSpeed;
      goto LAB_004c4cd8;
    }
    break;
  case AMMO1:
    if (statusBar->ammo1 == (AAmmo *)0x0) goto LAB_004c4d67;
    uVar21 = statusBar->ammocount1;
    break;
  case AMMO2:
    if (statusBar->ammo2 == (AAmmo *)0x0) goto LAB_004c4d67;
    uVar21 = statusBar->ammocount2;
    break;
  default:
    pAVar7 = AActor::FindInventory
                       (&((statusBar->super_DBaseStatusBar).CPlayer)->mo->super_AActor,
                        this->inventoryItem,false);
    uVar21 = 0;
    if (pAVar7 != (AInventory *)0x0) {
      uVar21 = pAVar7->Amount;
    }
    break;
  case AMMO1CAPACITY:
    pAVar9 = statusBar->ammo1;
    goto LAB_004c4a3f;
  case AMMO2CAPACITY:
    pAVar9 = statusBar->ammo2;
LAB_004c4a3f:
    if (pAVar9 == (AAmmo *)0x0) goto LAB_004c4d67;
LAB_004c4a84:
    uVar21 = (pAVar9->super_AInventory).MaxAmount;
    break;
  case AMMOCAPACITY:
    pAVar9 = (AAmmo *)AActor::FindInventory
                                (&((statusBar->super_DBaseStatusBar).CPlayer)->mo->super_AActor,
                                 this->inventoryItem,false);
    if (pAVar9 == (AAmmo *)0x0) {
      pAVar9 = (AAmmo *)(this->inventoryItem->super_PClass).Defaults;
    }
    goto LAB_004c4a84;
  case FRAGS:
    uVar21 = ((statusBar->super_DBaseStatusBar).CPlayer)->fragcount;
    break;
  case KILLS:
    uVar21 = level.killed_monsters;
    break;
  case MONSTERS:
    uVar21 = level.total_monsters;
    break;
  case ITEMS:
    uVar21 = level.found_items;
    break;
  case TOTALITEMS:
    uVar21 = level.total_items;
    break;
  case SECRETS:
    uVar21 = level.found_secrets;
    break;
  case TOTALSECRETS:
    uVar21 = level.total_secrets;
    break;
  case ARMORCLASS:
  case SAVEPERCENT:
    pAVar7 = AActor::FindInventory
                       (&((statusBar->super_DBaseStatusBar).CPlayer)->mo->super_AActor,
                        (PClassActor *)AHexenArmor::RegistrationInfo.MyClass,false);
    if (pAVar7 == (AInventory *)0x0) {
      dVar23 = 0.0;
    }
    else {
      dVar23 = (double)pAVar7[1].super_AActor.super_DThinker.super_DObject._vptr_DObject +
               (double)pAVar7[1].super_AActor.super_DThinker.super_DObject.Class +
               (double)pAVar7[1].super_AActor.super_DThinker.super_DObject.ObjNext +
               (double)pAVar7[1].super_AActor.super_DThinker.super_DObject.GCNext +
               *(double *)&pAVar7[1].super_AActor.super_DThinker.super_DObject.ObjectFlags;
    }
    if (statusBar->armor != (ABasicArmor *)0x0) {
      dVar23 = dVar23 + statusBar->armor->SavePercent * 100.0;
    }
    if (this->value == ARMORCLASS) {
      dVar23 = dVar23 / 5.0;
    }
    uVar21 = (int)dVar23;
    break;
  case GLOBALVAR:
    uVar21 = ACS_GlobalVars[(int)uVar21];
    break;
  case GLOBALARRAY:
    pNVar10 = TMap<int,_int,_THashTraits<int>,_InitIntToZero>::GetNode
                        (ACS_GlobalArrays + (int)uVar21,consoleplayer);
    uVar21 = (pNVar10->Pair).Value;
    break;
  case POWERUPTIME:
    pAVar7 = AActor::FindInventory
                       (&((statusBar->super_DBaseStatusBar).CPlayer)->mo->super_AActor,
                        *(PClassActor **)((this->inventoryItem->super_PClass).Defaults + 0x500),
                        false);
    if (pAVar7 != (AInventory *)0x0) {
      uVar21 = *(int *)&pAVar7->field_0x4fc / 0x23 + 1;
    }
    break;
  case AIRTIME:
    ppVar1 = (statusBar->super_DBaseStatusBar).CPlayer;
    if ((ppVar1->mo->super_AActor).waterlevel < 3) {
      uVar21 = level.airsupply / 0x23;
    }
    else {
      iVar5 = ppVar1->air_finished - level.time;
      iVar5 = iVar5 + (int)((ulong)((long)(iVar5 + 0x22) * -0x15f15f15) >> 0x20) + 0x22;
      uVar22 = (iVar5 >> 5) - (iVar5 >> 0x1f);
      uVar21 = 0;
      if (0 < (int)uVar22) {
        uVar21 = uVar22;
      }
    }
    break;
  case SELECTEDINVENTORY:
    pAVar2 = ((statusBar->super_DBaseStatusBar).CPlayer)->mo;
    pAVar7 = (pAVar2->InvSel).field_0.p;
    if (pAVar7 != (AInventory *)0x0) {
      if (((pAVar7->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) == 0) {
        uVar21 = pAVar7->Amount;
      }
      else {
        (pAVar2->InvSel).field_0.p = (AInventory *)0x0;
      }
    }
    break;
  case SCORE:
    uVar21 = (((statusBar->super_DBaseStatusBar).CPlayer)->mo->super_AActor).Score;
    break;
  case ACCURACY:
    uVar21 = (((statusBar->super_DBaseStatusBar).CPlayer)->mo->super_AActor).accuracy;
    break;
  case STAMINA:
    uVar21 = (((statusBar->super_DBaseStatusBar).CPlayer)->mo->super_AActor).stamina;
    break;
  case KEYS:
    pAVar2 = ((statusBar->super_DBaseStatusBar).CPlayer)->mo;
    pAVar7 = (pAVar2->super_AActor).Inventory.field_0.p;
    uVar21 = 0;
    if (pAVar7 != (AInventory *)0x0) {
      if (((pAVar7->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) == 0) {
        uVar21 = 0;
        pPVar15 = AKey::RegistrationInfo.MyClass;
        do {
          pAVar11 = pAVar7;
          pPVar12 = (pAVar11->super_AActor).super_DThinker.super_DObject.Class;
          pPVar16 = pPVar15;
          if (pPVar12 == (PClass *)0x0) {
            iVar5 = (**(pAVar11->super_AActor).super_DThinker.super_DObject._vptr_DObject)(pAVar11);
            pPVar12 = (PClass *)CONCAT44(extraout_var,iVar5);
            (pAVar11->super_AActor).super_DThinker.super_DObject.Class = pPVar12;
            pPVar16 = AKey::RegistrationInfo.MyClass;
          }
          uVar22 = (uint)(pPVar12 != (PClass *)0x0);
          if (pPVar12 != pPVar15 && pPVar12 != (PClass *)0x0) {
            do {
              pPVar12 = pPVar12->ParentClass;
              uVar22 = (uint)(pPVar12 != (PClass *)0x0);
              if (pPVar12 == pPVar15) break;
            } while (pPVar12 != (PClass *)0x0);
          }
          uVar21 = uVar21 + uVar22;
          pAVar7 = (pAVar11->super_AActor).Inventory.field_0.p;
          if (pAVar7 == (AInventory *)0x0) goto LAB_004c4cf5;
          pPVar15 = pPVar16;
        } while (((pAVar7->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) == 0);
        (pAVar11->super_AActor).Inventory.field_0.p = (AInventory *)0x0;
      }
      else {
        (pAVar2->super_AActor).Inventory.field_0.p = (AInventory *)0x0;
      }
    }
    break;
  case INTCVAR:
    pFVar8 = GetCVar(&((statusBar->super_DBaseStatusBar).CPlayer)->mo->super_AActor,
                     (this->cvarName).Chars);
    uVar21 = 0;
    if ((pFVar8 != (FBaseCVar *)0x0) && (uVar22 = (*pFVar8->_vptr_FBaseCVar[2])(pFVar8), uVar22 < 2)
       ) {
      uVar21 = (*pFVar8->_vptr_FBaseCVar[4])(pFVar8,1);
    }
  }
LAB_004c4cf5:
  iVar5 = this->interpolationSpeed;
  if ((iVar5 == 0) || ((hudChanged && (level.time != 1)))) {
LAB_004c4d0e:
    this->drawValue = uVar21;
    uVar22 = uVar21;
  }
  else {
    uVar22 = this->drawValue;
    if ((int)uVar21 < (int)uVar22) {
      iVar17 = (int)(uVar22 - uVar21) >> 2;
      if (iVar17 < iVar5) {
        iVar5 = iVar17;
      }
      iVar18 = 1;
      if (1 < iVar17) {
        iVar18 = iVar5;
      }
      uVar22 = uVar22 - iVar18;
      this->drawValue = uVar22;
    }
    else if (uVar21 - uVar22 != 0 && (int)uVar22 <= (int)uVar21) {
      iVar17 = (int)(uVar21 - uVar22) >> 2;
      if (iVar17 < iVar5) {
        iVar5 = iVar17;
      }
      iVar18 = 1;
      if (1 < iVar17) {
        iVar18 = iVar5;
      }
      uVar21 = iVar18 + uVar22;
      goto LAB_004c4d0e;
    }
  }
  if (((this->super_CommandDrawString).field_0x5d == '\x01') && (uVar22 == 0)) {
LAB_004c4d67:
    FString::operator=(&(this->super_CommandDrawString).str,(char *)"");
    return;
  }
  iVar5 = this->lowValue;
  (this->super_CommandDrawString).translation = this->normalTranslation;
  if (((iVar5 != -1) && (lVar13 = 0x70, (int)uVar22 <= iVar5)) ||
     ((this->highValue != -1 && (lVar13 = 0x78, this->highValue <= (int)uVar22)))) {
    (this->super_CommandDrawString).translation =
         *(EColorRange *)
          ((long)&(this->super_CommandDrawString).super_SBarInfoCommand._vptr_SBarInfoCommand +
          lVar13);
  }
  bVar20 = (this->super_CommandDrawString).field_0x5c;
  iVar5 = this->length;
  if ((this->super_CommandDrawString).field_0x5e == '\0') {
    uVar22 = 0x7fffffff;
    bVar14 = bVar20;
    if (iVar5 < 10) {
      dVar23 = pow(10.0,(double)iVar5);
      dVar23 = ceil(dVar23);
      uVar22 = (int)dVar23 - 1;
      bVar14 = (this->super_CommandDrawString).field_0x5c;
    }
    if ((bVar14 & 1) == 0) {
      uVar21 = this->drawValue;
LAB_004c4e9b:
      uVar6 = -uVar22;
    }
    else {
      uVar21 = this->drawValue;
      iVar5 = this->length;
      if (iVar5 == 1) goto LAB_004c4e9b;
      uVar6 = 0x80000000;
      if (iVar5 < 10) {
        dVar23 = pow(10.0,(double)(iVar5 + -1));
        dVar23 = ceil(dVar23);
        uVar6 = (uint)-(dVar23 + -1.0);
      }
    }
    if ((int)uVar21 < (int)uVar22) {
      uVar22 = uVar21;
    }
    if ((int)uVar21 <= (int)uVar6) {
      uVar22 = uVar6;
    }
  }
  else {
    if (9 < iVar5) goto LAB_004c4eb2;
    dVar23 = pow(10.0,(double)(int)(iVar5 - (uint)((int)uVar22 < 0 && 1 < iVar5)));
    dVar23 = ceil(dVar23);
    bVar14 = 1;
    if (this->drawValue < (int)dVar23) {
      bVar14 = bVar20;
    }
    bVar20 = bVar14;
    uVar22 = this->drawValue % (int)dVar23;
  }
  this->drawValue = uVar22;
LAB_004c4eb2:
  if ((this->super_CommandDrawString).field_0x5f == '\0') {
    pBVar19 = "";
  }
  else {
    pBVar19 = (BYTE *)(this->super_CommandDrawString).str.Chars;
  }
  this_00 = &(this->super_CommandDrawString).str;
  pcVar4 = (this->prefixPadding).Chars;
  if (bVar20 == 0) {
    FString::Format(this_00,"%s%s%d",pBVar19,pcVar4,(ulong)uVar22);
  }
  else {
    FString::Format(this_00,"%s%s%0*d",pBVar19,pcVar4,
                    (ulong)(uint)(((int)uVar22 >> 0x1f) + this->length),(ulong)uVar22);
  }
  CommandDrawString::RealignString(&this->super_CommandDrawString);
  return;
}

Assistant:

void	Tick(const SBarInfoMainBlock *block, const DSBarInfo *statusBar, bool hudChanged)
		{
			if(usePrefix)
			{
				cache = -1; // Disable the cache since we are using the same variables.
				CommandDrawString::Tick(block, statusBar, hudChanged);
			}

			int num = valueArgument;
			switch(value)
			{
				case HEALTH:
					num = statusBar->CPlayer->mo->health;
					if(script->lowerHealthCap && num < 0) //health shouldn't display negatives
						num = 0;
					if(script->interpolateHealth)
						interpolationSpeed = script->interpolationSpeed;
					break;
				case ARMOR:
					num = statusBar->armor != NULL ? statusBar->armor->Amount : 0;
					if(script->interpolateArmor)
						interpolationSpeed = script->armorInterpolationSpeed;
					break;
				case AMMO1:
					if(statusBar->ammo1 == NULL) //no ammo, do not draw
					{
						str = "";
						return;
					}
					num = statusBar->ammocount1;
					break;
				case AMMO2:
					if(statusBar->ammo2 == NULL) //no ammo, do not draw
					{
						str = "";
						return;
					}
					num = statusBar->ammocount2;
					break;
				case AMMO:
				{
					AInventory* item = statusBar->CPlayer->mo->FindInventory(inventoryItem);
					if(item != NULL)
						num = item->Amount;
					else
						num = 0;
					break;
				}
				case AMMO1CAPACITY:
					if(statusBar->ammo1 == NULL) //no ammo, do not draw
					{
						str = "";
						return;
					}
					else
						num = statusBar->ammo1->MaxAmount;
					break;
				case AMMO2CAPACITY:
					if(statusBar->ammo2 == NULL) //no ammo, do not draw
					{
						str = "";
						return;
					}
					else
						num = statusBar->ammo2->MaxAmount;
					break;
				case AMMOCAPACITY:
				{
					AInventory* item = statusBar->CPlayer->mo->FindInventory(inventoryItem);
					if(item != NULL)
						num = item->MaxAmount;
					else
						num = ((AInventory *)GetDefaultByType(inventoryItem))->MaxAmount;
					break;
				}
				case FRAGS:
					num = statusBar->CPlayer->fragcount;
					break;
				case KILLS:
					num = level.killed_monsters;
					break;
				case MONSTERS:
					num = level.total_monsters;
					break;
				case ITEMS:
					num = level.found_items;
					break;
				case TOTALITEMS:
					num = level.total_items;
					break;
				case SECRETS:
					num = level.found_secrets;
					break;
				case SCORE:
					num = statusBar->CPlayer->mo->Score;
					break;
				case TOTALSECRETS:
					num = level.total_secrets;
					break;
				case ARMORCLASS:
				case SAVEPERCENT:
				{
					double add = 0;
					AHexenArmor *harmor = statusBar->CPlayer->mo->FindInventory<AHexenArmor>();
					if(harmor != NULL)
					{
						add = harmor->Slots[0] + harmor->Slots[1] +
							harmor->Slots[2] + harmor->Slots[3] + harmor->Slots[4];
					}
					//Hexen counts basic armor also so we should too.
					if(statusBar->armor != NULL)
					{
						add += statusBar->armor->SavePercent * 100;
					}
					if(value == ARMORCLASS)
						add /= 5;
					num = int(add);
					break;
				}
				case GLOBALVAR:
					num = ACS_GlobalVars[valueArgument];
					break;
				case GLOBALARRAY:
					num = ACS_GlobalArrays[valueArgument][consoleplayer];
					break;
				case POWERUPTIME:
				{
					//Get the PowerupType and check to see if the player has any in inventory.
					PClassActor* powerupType = ((APowerupGiver*) GetDefaultByType(inventoryItem))->PowerupType;
					APowerup* powerup = (APowerup*) statusBar->CPlayer->mo->FindInventory(powerupType);
					if(powerup != NULL)
						num = powerup->EffectTics / TICRATE + 1;
					break;
				}
				case INVENTORY:
				{
					AInventory* item = statusBar->CPlayer->mo->FindInventory(inventoryItem);
					if(item != NULL)
						num = item->Amount;
					else
						num = 0;
					break;
				}
				case AIRTIME:
				{
					if(statusBar->CPlayer->mo->waterlevel < 3)
						num = level.airsupply/TICRATE;
					else
						num = clamp<int>((statusBar->CPlayer->air_finished - level.time + (TICRATE-1))/TICRATE, 0, INT_MAX);
					break;
				}
				case SELECTEDINVENTORY:
					if(statusBar->CPlayer->mo->InvSel != NULL)
						num = statusBar->CPlayer->mo->InvSel->Amount;
					break;
				case ACCURACY:
					num = statusBar->CPlayer->mo->accuracy;
					break;
				case STAMINA:
					num = statusBar->CPlayer->mo->stamina;
					break;
				case KEYS:
					num = 0;
					for(AInventory *item = statusBar->CPlayer->mo->Inventory;item != NULL;item = item->Inventory)
					{
						if(item->IsKindOf(RUNTIME_CLASS(AKey)))
							num++;
					}
					break;
				case INTCVAR:
				{
					FBaseCVar *CVar = GetCVar(statusBar->CPlayer->mo, cvarName);
					if (CVar != nullptr)
					{
						ECVarType cvartype = CVar->GetRealType();

						if (cvartype == CVAR_Bool || cvartype == CVAR_Int)
						{
							num = CVar->GetGenericRep(CVAR_Int).Int;
							break;
						}
					}

					// Fallback in case of bad cvar/type. Unset can remove a cvar at will.
					num = 0;
					break;
				}
				default: break;
			}
			if(interpolationSpeed != 0 && (!hudChanged || level.time == 1))
			{
				if(num < drawValue)
					drawValue -= clamp<int>((drawValue - num) >> 2, 1, interpolationSpeed);
				else if(drawValue < num)
					drawValue += clamp<int>((num - drawValue) >> 2, 1, interpolationSpeed);
			}
			else
				drawValue = num;
			if(whenNotZero && drawValue == 0)
			{
				str = "";
				return;
			}
		
			translation = normalTranslation;
			if(lowValue != -1 && drawValue <= lowValue) //low
				translation = lowTranslation;
			else if(highValue != -1 && drawValue >= highValue) //high
				translation = highTranslation;

			bool useFillZeros = fillZeros;
			if(!dontCap)
			{
				// 10^9 is a largest we can hold in a 32-bit int.  So if we go any larger we have to toss out the positions limit.
				int maxval = length <= 9 ? (int) ceil(pow(10., length))-1 : INT_MAX;
				if(!fillZeros || length == 1)
					drawValue = clamp(drawValue, -maxval, maxval);
				else //The community wanted negatives to take the last digit, but we can only do this if there is room
					drawValue = clamp(drawValue, length <= 9 ? (int) -(ceil(pow(10., length-1))-1) : INT_MIN, maxval);
			}
			else if(length <= 9)
			{
				int limit = (int) ceil(pow(10., length > 1 && drawValue < 0 ? length - 1 : length));
				if(drawValue >= limit)
					useFillZeros = true;
				drawValue = drawValue%limit;
			}

			if(useFillZeros)
				str.Format("%s%s%0*d", usePrefix ? str.GetChars() : "", prefixPadding.GetChars(), drawValue < 0 ? length - 1 : length, drawValue);
			else
				str.Format("%s%s%d", usePrefix ? str.GetChars() : "", prefixPadding.GetChars(), drawValue);

			RealignString();
		}